

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O2

PrimInfo * __thiscall
embree::avx512::
CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx512::CurveGeometryInterface,_embree::CatmullRomCurveT>
::createPrimRefArray
          (PrimInfo *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx512::CurveGeometryInterface,_embree::CatmullRomCurveT>
          *this,PrimRef *prims,range<unsigned_long> *r,size_t k,uint geomID)

{
  uint uVar1;
  BufferView<embree::Vec3fx> *pBVar2;
  BufferView<embree::Vec3fa> *pBVar3;
  long lVar4;
  long lVar5;
  char *pcVar6;
  size_t sVar7;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar8;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  ulong uVar26;
  long lVar27;
  unsigned_long uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 in_YmmResult [32];
  undefined1 auVar53 [32];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar57 [32];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  vfloat4 a0_2;
  undefined1 auVar81 [16];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  vfloat4 a0;
  undefined1 auVar84 [16];
  float fVar85;
  Vec3fa n0;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [32];
  Vec3fa n1;
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  vfloat4 a0_1;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [64];
  float fVar100;
  undefined1 auVar101 [16];
  undefined1 auVar102 [32];
  float fVar103;
  undefined1 auVar104 [32];
  vfloat4 b0_1;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [32];
  float fVar108;
  undefined4 uVar109;
  float fVar112;
  float fVar113;
  vfloat4 b1;
  float fVar114;
  undefined1 auVar110 [32];
  undefined1 auVar111 [64];
  float fVar115;
  float fVar116;
  float fVar117;
  undefined1 auVar118 [16];
  undefined1 auVar119 [32];
  undefined1 auVar120 [64];
  __m128 a;
  undefined1 auVar121 [16];
  undefined1 auVar122 [32];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  vfloat4 b0;
  undefined1 auVar125 [16];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [16];
  undefined1 in_ZMM24 [64];
  undefined1 in_ZMM25 [64];
  size_t local_218;
  size_t local_210;
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined8 uStack_190;
  undefined1 auVar58 [32];
  
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  uVar28 = r->_begin;
  local_1f8._8_4_ = 0xff800000;
  local_1f8._0_8_ = 0xff800000ff800000;
  local_1f8._12_4_ = 0xff800000;
  local_218 = 0;
  auVar99 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
  auVar111 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
  auVar120 = ZEXT1664(CONCAT412(0x5dccb9a2,CONCAT48(0x5dccb9a2,0x5dccb9a25dccb9a2)));
  local_1e8._8_4_ = 0x7f800000;
  local_1e8._0_8_ = 0x7f8000007f800000;
  local_1e8._12_4_ = 0x7f800000;
  local_208._8_4_ = 0x7f800000;
  local_208._0_8_ = 0x7f8000007f800000;
  local_208._12_4_ = 0x7f800000;
  local_210 = k;
  local_1d8 = local_1f8;
  do {
    if (r->_end <= uVar28) {
      *(undefined8 *)
       &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
        field_0 = local_208._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
               lower.field_0 + 8) = local_208._8_8_;
      *(undefined8 *)
       &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
        field_0 = local_1f8._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
               upper.field_0 + 8) = local_1f8._8_8_;
      *(undefined8 *)
       &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
        field_0 = local_1e8._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
               lower.field_0 + 8) = local_1e8._8_8_;
      *(undefined8 *)
       &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
        field_0 = local_1d8._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
               upper.field_0 + 8) = local_1d8._8_8_;
      __return_storage_ptr__->end = local_218;
      return __return_storage_ptr__;
    }
    pBVar2 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
             vertices.items;
    uVar1 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                super_CurveGeometry.super_Geometry.field_0x58 +
                     *(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                               super_CurveGeometry.field_0x68 * uVar28);
    uVar26 = (ulong)uVar1;
    uVar29 = (ulong)(uVar1 + 3);
    if (uVar29 < (pBVar2->super_RawBufferView).num) {
      uVar30 = (ulong)(uVar1 + 1);
      uVar31 = (ulong)(uVar1 + 2);
      fVar116 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
                maxRadiusScale;
      pBVar3 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
               normals.items;
      lVar27 = 0;
      do {
        auVar59._16_16_ = in_YmmResult._16_16_;
        if ((ulong)((this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                    super_CurveGeometry.super_Geometry.numTimeSteps - 1) * 0x38 + 0x70 ==
            lVar27 + 0x38) {
          pcVar6 = (pBVar2->super_RawBufferView).ptr_ofs;
          sVar7 = (pBVar2->super_RawBufferView).stride;
          fVar116 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                    super_CurveGeometry.maxRadiusScale;
          auVar88 = vinsertps_avx(*(undefined1 (*) [16])(pcVar6 + sVar7 * uVar26),
                                  ZEXT416((uint)(fVar116 * *(float *)(pcVar6 + sVar7 * uVar26 + 0xc)
                                                )),0x30);
          auVar89 = vinsertps_avx(*(undefined1 (*) [16])(pcVar6 + sVar7 * uVar30),
                                  ZEXT416((uint)(fVar116 * *(float *)(pcVar6 + sVar7 * uVar30 + 0xc)
                                                )),0x30);
          auVar48 = vinsertps_avx(*(undefined1 (*) [16])(pcVar6 + sVar7 * uVar31),
                                  ZEXT416((uint)(fVar116 * *(float *)(pcVar6 + sVar7 * uVar31 + 0xc)
                                                )),0x30);
          auVar40 = vinsertps_avx(*(undefined1 (*) [16])(pcVar6 + sVar7 * uVar29),
                                  ZEXT416((uint)(fVar116 * *(float *)(pcVar6 + sVar7 * uVar29 + 0xc)
                                                )),0x30);
          auVar44 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
          auVar33 = vmulps_avx512vl(auVar40,auVar44);
          auVar32 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar48,auVar33);
          auVar32 = vaddps_avx512vl(auVar89,auVar32);
          auVar34 = vfmadd231ps_avx512vl(auVar32,auVar88,auVar44);
          auVar35 = vshufps_avx512vl(auVar34,auVar34,0xff);
          pBVar3 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                   super_CurveGeometry.normals.items;
          pcVar6 = (pBVar3->super_RawBufferView).ptr_ofs;
          sVar7 = (pBVar3->super_RawBufferView).stride;
          auVar32 = *(undefined1 (*) [16])(pcVar6 + uVar26 * sVar7);
          auVar47 = *(undefined1 (*) [16])(pcVar6 + uVar30 * sVar7);
          auVar36 = *(undefined1 (*) [16])(pcVar6 + uVar31 * sVar7);
          auVar45 = *(undefined1 (*) [16])(pcVar6 + sVar7 * uVar29);
          auVar37 = vmulps_avx512vl(auVar45,auVar44);
          auVar49 = vfmadd213ps_avx512vl(ZEXT816(0) << 0x20,auVar36,auVar37);
          auVar46._0_4_ = auVar47._0_4_ + auVar49._0_4_;
          auVar46._4_4_ = auVar47._4_4_ + auVar49._4_4_;
          auVar46._8_4_ = auVar47._8_4_ + auVar49._8_4_;
          auVar46._12_4_ = auVar47._12_4_ + auVar49._12_4_;
          auVar46 = vfmadd231ps_avx512vl(auVar46,auVar32,auVar44);
          auVar72._0_16_ = vxorps_avx512vl(in_ZMM25._0_16_,in_ZMM25._0_16_);
          auVar49 = vmulps_avx512vl(auVar40,auVar72._0_16_);
          auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
          auVar49 = vfmadd231ps_avx512vl(auVar49,auVar48,auVar38);
          auVar49 = vfmadd231ps_avx512vl(auVar49,auVar89,auVar72._0_16_);
          auVar39 = vfnmadd231ps_avx512vl(auVar49,auVar88,auVar38);
          auVar41 = vshufps_avx512vl(auVar39,auVar39,0xc9);
          auVar49 = vshufps_avx(auVar46,auVar46,0xc9);
          auVar49 = vmulps_avx512vl(auVar39,auVar49);
          auVar49 = vfmsub231ps_fma(auVar49,auVar41,auVar46);
          auVar46 = vshufps_avx(auVar49,auVar49,0xc9);
          auVar49 = vdpps_avx(auVar46,auVar46,0x7f);
          auVar72._16_16_ = auVar59._16_16_;
          auVar55._4_28_ = auVar72._4_28_;
          auVar55._0_4_ = auVar49._0_4_;
          auVar42 = vrsqrt14ss_avx512f(auVar72._0_16_,auVar55._0_16_);
          auVar43 = vmulss_avx512f(auVar42,ZEXT416(0x3fc00000));
          auVar50 = vmulss_avx512f(auVar49,ZEXT416(0xbf000000));
          auVar50 = vmulss_avx512f(auVar50,auVar42);
          auVar42 = vmulss_avx512f(auVar50,ZEXT416((uint)(auVar42._0_4_ * auVar42._0_4_)));
          fVar116 = auVar43._0_4_ + auVar42._0_4_;
          auVar128._0_4_ = fVar116 * auVar46._0_4_;
          auVar128._4_4_ = fVar116 * auVar46._4_4_;
          auVar128._8_4_ = fVar116 * auVar46._8_4_;
          auVar128._12_4_ = fVar116 * auVar46._12_4_;
          auVar42 = vmulps_avx512vl(auVar35,auVar128);
          auVar43 = vaddps_avx512vl(auVar34,auVar42);
          auVar59 = vbroadcastss_avx512vl(ZEXT416(2));
          auVar56 = vpermps_avx512vl(auVar59,ZEXT1632(auVar43));
          auVar65._8_8_ = bezier_basis0._1640_8_;
          auVar65._0_8_ = bezier_basis0._1632_8_;
          auVar65._16_8_ = bezier_basis0._1648_8_;
          auVar65._24_8_ = bezier_basis0._1656_8_;
          in_ZMM24 = ZEXT3264(auVar65);
          auVar50 = vshufps_avx512vl(auVar39,auVar39,0xff);
          auVar50 = vmulps_avx512vl(auVar50,auVar128);
          auVar51 = vrcp14ss_avx512f(auVar72._0_16_,auVar55._0_16_);
          auVar52 = vbroadcastss_avx512vl(auVar49);
          auVar49 = vfnmadd213ss_avx512f(auVar49,auVar51,ZEXT416(0x40000000));
          fVar100 = auVar51._0_4_ * auVar49._0_4_;
          auVar49 = vmulps_avx512vl(auVar45,auVar72._0_16_);
          auVar49 = vfmadd231ps_avx512vl(auVar49,auVar36,auVar38);
          auVar49 = vfmadd231ps_avx512vl(auVar49,auVar47,auVar72._0_16_);
          auVar49 = vfnmadd231ps_avx512vl(auVar49,auVar32,auVar38);
          auVar51 = vshufps_avx512vl(auVar49,auVar49,0xc9);
          auVar51 = vmulps_avx512vl(auVar39,auVar51);
          auVar49 = vfmsub231ps_avx512vl(auVar51,auVar41,auVar49);
          auVar49 = vshufps_avx512vl(auVar49,auVar49,0xc9);
          auVar41 = vmulps_avx512vl(auVar52,auVar49);
          auVar49 = vdpps_avx(auVar46,auVar49,0x7f);
          fVar85 = auVar49._0_4_;
          auVar52._0_4_ = fVar85 * auVar46._0_4_;
          auVar52._4_4_ = fVar85 * auVar46._4_4_;
          auVar52._8_4_ = fVar85 * auVar46._8_4_;
          auVar52._12_4_ = fVar85 * auVar46._12_4_;
          auVar49 = vsubps_avx(auVar41,auVar52);
          auVar51._0_8_ =
               CONCAT44(auVar50._4_4_ + auVar35._4_4_ * fVar116 * fVar100 * auVar49._4_4_,
                        auVar50._0_4_ + auVar35._0_4_ * fVar116 * fVar100 * auVar49._0_4_);
          auVar51._8_4_ = auVar50._8_4_ + auVar35._8_4_ * fVar116 * fVar100 * auVar49._8_4_;
          auVar51._12_4_ = auVar50._12_4_ + auVar35._12_4_ * fVar116 * fVar100 * auVar49._12_4_;
          uStack_190 = auVar51._8_8_;
          auVar49 = vaddps_avx512vl(auVar39,auVar51);
          auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaab));
          auVar49 = vmulps_avx512vl(auVar49,auVar46);
          auVar35 = vaddps_avx512vl(auVar43,auVar49);
          auVar55 = vpermps_avx512vl(auVar59,ZEXT1632(auVar35));
          auVar66._8_8_ = bezier_basis0._2796_8_;
          auVar66._0_8_ = bezier_basis0._2788_8_;
          auVar66._16_8_ = bezier_basis0._2804_8_;
          auVar66._24_8_ = bezier_basis0._2812_8_;
          auVar41._0_4_ = auVar48._0_4_ + auVar33._0_4_;
          auVar41._4_4_ = auVar48._4_4_ + auVar33._4_4_;
          auVar41._8_4_ = auVar48._8_4_ + auVar33._8_4_;
          auVar41._12_4_ = auVar48._12_4_ + auVar33._12_4_;
          auVar73._16_16_ = auVar66._16_16_;
          auVar33 = vfmadd231ps_avx512vl(auVar41,auVar89,auVar72._0_16_);
          auVar49 = vaddps_avx512vl(auVar36,auVar37);
          auVar49 = vfmadd231ps_avx512vl(auVar49,auVar47,auVar72._0_16_);
          auVar37 = vfmadd231ps_avx512vl(auVar49,auVar32,auVar44);
          auVar49 = vmulps_avx512vl(auVar40,auVar38);
          auVar49 = vfmadd231ps_avx512vl(auVar49,auVar72._0_16_,auVar48);
          auVar49 = vfnmadd231ps_avx512vl(auVar49,auVar38,auVar89);
          auVar40 = vfmadd231ps_avx512vl(auVar49,auVar72._0_16_,auVar88);
          auVar89 = vshufps_avx(auVar40,auVar40,0xc9);
          auVar49 = vshufps_avx(auVar37,auVar37,0xc9);
          fVar85 = auVar40._0_4_;
          auVar94._0_4_ = fVar85 * auVar49._0_4_;
          fVar103 = auVar40._4_4_;
          auVar94._4_4_ = fVar103 * auVar49._4_4_;
          fVar108 = auVar40._8_4_;
          auVar94._8_4_ = fVar108 * auVar49._8_4_;
          fVar112 = auVar40._12_4_;
          auVar94._12_4_ = fVar112 * auVar49._12_4_;
          auVar49 = vfmsub231ps_fma(auVar94,auVar89,auVar37);
          auVar48 = vshufps_avx(auVar49,auVar49,0xc9);
          auVar49 = vdpps_avx(auVar48,auVar48,0x7f);
          auVar44 = vfmadd231ps_avx512vl(auVar33,auVar88,auVar44);
          auVar88 = vshufps_avx(auVar44,auVar44,0xff);
          auVar73._0_16_ = auVar72._0_16_;
          auVar74._4_28_ = auVar73._4_28_;
          auVar74._0_4_ = auVar49._0_4_;
          auVar33 = vrsqrt14ss_avx512f(auVar72._0_16_,auVar74._0_16_);
          fVar116 = auVar33._0_4_;
          auVar33 = vmulss_avx512f(auVar49,ZEXT416(0xbf000000));
          fVar116 = fVar116 * 1.5 + auVar33._0_4_ * fVar116 * fVar116 * fVar116;
          auVar37._4_4_ = fVar116;
          auVar37._0_4_ = fVar116;
          auVar37._8_4_ = fVar116;
          auVar37._12_4_ = fVar116;
          auVar33 = vmulps_avx512vl(auVar48,auVar37);
          auVar37 = vmulps_avx512vl(auVar88,auVar33);
          auVar124._0_4_ = auVar37._0_4_ + auVar44._0_4_;
          auVar124._4_4_ = auVar37._4_4_ + auVar44._4_4_;
          auVar124._8_4_ = auVar37._8_4_ + auVar44._8_4_;
          auVar124._12_4_ = auVar37._12_4_ + auVar44._12_4_;
          auVar41 = vshufps_avx512vl(auVar40,auVar40,0xff);
          auVar33 = vmulps_avx512vl(auVar41,auVar33);
          auVar41 = vbroadcastss_avx512vl(auVar49);
          auVar45 = vmulps_avx512vl(auVar45,auVar38);
          auVar36 = vfmadd231ps_avx512vl(auVar45,auVar72._0_16_,auVar36);
          auVar47 = vfnmadd231ps_avx512vl(auVar36,auVar38,auVar47);
          auVar47 = vfmadd231ps_avx512vl(auVar47,auVar72._0_16_,auVar32);
          auVar32 = vshufps_avx(auVar47,auVar47,0xc9);
          auVar38._0_4_ = fVar85 * auVar32._0_4_;
          auVar38._4_4_ = fVar103 * auVar32._4_4_;
          auVar38._8_4_ = fVar108 * auVar32._8_4_;
          auVar38._12_4_ = fVar112 * auVar32._12_4_;
          auVar32 = vfmsub231ps_fma(auVar38,auVar89,auVar47);
          auVar32 = vshufps_avx(auVar32,auVar32,0xc9);
          auVar47 = vmulps_avx512vl(auVar41,auVar32);
          auVar32 = vdpps_avx(auVar48,auVar32,0x7f);
          fVar100 = auVar32._0_4_;
          auVar50._0_4_ = auVar48._0_4_ * fVar100;
          auVar50._4_4_ = auVar48._4_4_ * fVar100;
          auVar50._8_4_ = auVar48._8_4_ * fVar100;
          auVar50._12_4_ = auVar48._12_4_ * fVar100;
          auVar32 = vsubps_avx(auVar47,auVar50);
          auVar47 = vrcp14ss_avx512f(auVar72._0_16_,auVar74._0_16_);
          auVar36 = vfnmadd213ss_avx512f(auVar49,auVar47,ZEXT416(0x40000000));
          fVar100 = auVar47._0_4_ * auVar36._0_4_;
          auVar47._0_4_ = auVar88._0_4_ * fVar116 * auVar32._0_4_ * fVar100;
          auVar47._4_4_ = auVar88._4_4_ * fVar116 * auVar32._4_4_ * fVar100;
          auVar47._8_4_ = auVar88._8_4_ * fVar116 * auVar32._8_4_ * fVar100;
          auVar47._12_4_ = auVar88._12_4_ * fVar116 * auVar32._12_4_ * fVar100;
          auVar36 = vaddps_avx512vl(auVar33,auVar47);
          auVar45._0_4_ = fVar85 + auVar36._0_4_;
          auVar45._4_4_ = fVar103 + auVar36._4_4_;
          auVar45._8_4_ = fVar108 + auVar36._8_4_;
          auVar45._12_4_ = fVar112 + auVar36._12_4_;
          auVar32 = vmulps_avx512vl(auVar45,auVar46);
          auVar32 = vsubps_avx(auVar124,auVar32);
          auVar60 = vpermps_avx512vl(auVar59,ZEXT1632(auVar32));
          auVar59 = vpermps_avx512vl(auVar59,ZEXT1632(auVar124));
          auVar67._8_8_ = bezier_basis0._3952_8_;
          auVar67._0_8_ = bezier_basis0._3944_8_;
          auVar67._16_8_ = bezier_basis0._3960_8_;
          auVar67._24_8_ = bezier_basis0._3968_8_;
          fVar116 = (float)bezier_basis0._3944_8_;
          auVar75._0_4_ = auVar59._0_4_ * fVar116;
          fVar85 = SUB84(bezier_basis0._3944_8_,4);
          auVar75._4_4_ = auVar59._4_4_ * fVar85;
          fVar108 = (float)bezier_basis0._3952_8_;
          auVar75._8_4_ = auVar59._8_4_ * fVar108;
          fVar113 = SUB84(bezier_basis0._3952_8_,4);
          auVar75._12_4_ = auVar59._12_4_ * fVar113;
          fVar115 = (float)bezier_basis0._3960_8_;
          auVar75._16_4_ = auVar59._16_4_ * fVar115;
          fVar11 = SUB84(bezier_basis0._3960_8_,4);
          auVar75._20_4_ = auVar59._20_4_ * fVar11;
          fVar13 = (float)bezier_basis0._3968_8_;
          auVar75._24_4_ = auVar59._24_4_ * fVar13;
          auVar75._28_4_ = 0;
          auVar54 = vfmadd231ps_avx512vl(auVar75,auVar66,auVar60);
          auVar54 = vfmadd231ps_avx512vl(auVar54,auVar65,auVar55);
          auVar71._8_8_ = bezier_basis0._484_8_;
          auVar71._0_8_ = bezier_basis0._476_8_;
          auVar71._16_8_ = bezier_basis0._492_8_;
          auVar71._24_8_ = bezier_basis0._500_8_;
          auVar61 = vfmadd231ps_avx512vl(auVar54,auVar71,auVar56);
          auVar68._8_8_ = bezier_basis0._5108_8_;
          auVar68._0_8_ = bezier_basis0._5100_8_;
          auVar68._16_8_ = bezier_basis0._5116_8_;
          auVar68._24_8_ = bezier_basis0._5124_8_;
          auVar69._8_8_ = bezier_basis0._6264_8_;
          auVar69._0_8_ = bezier_basis0._6256_8_;
          auVar69._16_8_ = bezier_basis0._6272_8_;
          auVar69._24_8_ = bezier_basis0._6280_8_;
          auVar70._8_8_ = bezier_basis0._7420_8_;
          auVar70._0_8_ = bezier_basis0._7412_8_;
          auVar70._16_8_ = bezier_basis0._7428_8_;
          auVar70._24_8_ = bezier_basis0._7436_8_;
          auVar72 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
          auVar62 = vmaxps_avx512vl(auVar72,auVar61);
          fVar100 = bezier_basis0._8568_4_;
          fVar103 = bezier_basis0._8572_4_;
          auVar54._4_4_ = auVar59._4_4_ * fVar103;
          auVar54._0_4_ = auVar59._0_4_ * fVar100;
          fVar112 = bezier_basis0._8576_4_;
          auVar54._8_4_ = auVar59._8_4_ * fVar112;
          fVar114 = bezier_basis0._8580_4_;
          auVar54._12_4_ = auVar59._12_4_ * fVar114;
          fVar10 = bezier_basis0._8584_4_;
          auVar54._16_4_ = auVar59._16_4_ * fVar10;
          fVar12 = bezier_basis0._8588_4_;
          auVar54._20_4_ = auVar59._20_4_ * fVar12;
          fVar14 = bezier_basis0._8592_4_;
          auVar54._24_4_ = auVar59._24_4_ * fVar14;
          auVar54._28_4_ = auVar59._28_4_;
          auVar47 = vfmadd231ps_fma(auVar54,auVar70,auVar60);
          auVar59 = vfmadd231ps_avx512vl(ZEXT1632(auVar47),auVar69,auVar55);
          auVar59 = vfmadd231ps_avx512vl(auVar59,auVar68,auVar56);
          auVar73 = vbroadcastss_avx512vl(ZEXT416(0x3d638e39));
          auVar54 = vmulps_avx512vl(auVar59,auVar73);
          auVar59 = vblendps_avx(auVar54,ZEXT832(0) << 0x20,1);
          auVar55 = vsubps_avx(auVar61,auVar59);
          auVar59 = vblendps_avx(auVar54,ZEXT832(0) << 0x20,0x80);
          auVar78._0_4_ = auVar61._0_4_ + auVar59._0_4_;
          auVar78._4_4_ = auVar61._4_4_ + auVar59._4_4_;
          auVar78._8_4_ = auVar61._8_4_ + auVar59._8_4_;
          auVar78._12_4_ = auVar61._12_4_ + auVar59._12_4_;
          auVar78._16_4_ = auVar61._16_4_ + auVar59._16_4_;
          auVar78._20_4_ = auVar61._20_4_ + auVar59._20_4_;
          auVar78._24_4_ = auVar61._24_4_ + auVar59._24_4_;
          auVar78._28_4_ = auVar61._28_4_ + auVar59._28_4_;
          auVar59 = vmaxps_avx(auVar55,auVar78);
          auVar54 = vmaxps_avx(auVar62,auVar59);
          auVar74 = vbroadcastss_avx512vl(ZEXT416(1));
          auVar59 = vpermps_avx512vl(auVar74,ZEXT1632(auVar43));
          auVar56 = vpermps_avx512vl(auVar74,ZEXT1632(auVar35));
          auVar60 = vpermps_avx512vl(auVar74,ZEXT1632(auVar32));
          auVar62 = vpermps_avx512vl(auVar74,ZEXT1632(auVar124));
          auVar63 = vmulps_avx512vl(auVar62,auVar67);
          auVar63 = vfmadd231ps_avx512vl(auVar63,auVar66,auVar60);
          auVar63 = vfmadd231ps_avx512vl(auVar63,auVar65,auVar56);
          auVar63 = vfmadd231ps_avx512vl(auVar63,auVar71,auVar59);
          auVar62 = vmulps_avx512vl(auVar62,bezier_basis0._8568_32_);
          auVar60 = vfmadd231ps_avx512vl(auVar62,auVar70,auVar60);
          auVar62 = vmaxps_avx512vl(auVar72,auVar63);
          auVar56 = vfmadd231ps_avx512vl(auVar60,auVar69,auVar56);
          auVar59 = vfmadd231ps_avx512vl(auVar56,auVar68,auVar59);
          auVar56 = vmulps_avx512vl(auVar59,auVar73);
          auVar77 = ZEXT832(0) << 0x20;
          auVar59 = vblendps_avx(auVar56,auVar77,1);
          auVar60 = vsubps_avx512vl(auVar63,auVar59);
          auVar59 = vblendps_avx(auVar56,auVar77,0x80);
          auVar64 = vaddps_avx512vl(auVar63,auVar59);
          auVar59 = vmaxps_avx512vl(auVar60,auVar64);
          auVar75 = vmaxps_avx512vl(auVar62,auVar59);
          auVar59 = vbroadcastss_avx512vl(auVar43);
          auVar62 = vbroadcastss_avx512vl(auVar35);
          auVar76._0_4_ = auVar32._0_4_;
          auVar76._4_4_ = auVar76._0_4_;
          auVar76._8_4_ = auVar76._0_4_;
          auVar76._12_4_ = auVar76._0_4_;
          auVar76._16_4_ = auVar76._0_4_;
          auVar76._20_4_ = auVar76._0_4_;
          auVar76._24_4_ = auVar76._0_4_;
          auVar76._28_4_ = auVar76._0_4_;
          auVar79._4_4_ = auVar124._0_4_;
          auVar79._0_4_ = auVar124._0_4_;
          auVar79._8_4_ = auVar124._0_4_;
          auVar79._12_4_ = auVar124._0_4_;
          auVar79._16_4_ = auVar124._0_4_;
          auVar79._20_4_ = auVar124._0_4_;
          auVar79._24_4_ = auVar124._0_4_;
          auVar79._28_4_ = auVar124._0_4_;
          auVar56 = vmulps_avx512vl(auVar79,auVar67);
          auVar56 = vfmadd231ps_avx512vl(auVar56,auVar66,auVar76);
          auVar56 = vfmadd231ps_avx512vl(auVar56,auVar65,auVar62);
          auVar67 = vfmadd231ps_avx512vl(auVar56,auVar71,auVar59);
          auVar56._4_4_ = auVar124._0_4_ * fVar103;
          auVar56._0_4_ = auVar124._0_4_ * fVar100;
          auVar56._8_4_ = auVar124._0_4_ * fVar112;
          auVar56._12_4_ = auVar124._0_4_ * fVar114;
          auVar56._16_4_ = auVar124._0_4_ * fVar10;
          auVar56._20_4_ = auVar124._0_4_ * fVar12;
          auVar56._24_4_ = auVar124._0_4_ * fVar14;
          auVar56._28_4_ = auVar124._0_4_;
          auVar32 = vfmadd231ps_fma(auVar56,auVar70,auVar76);
          auVar56 = vmaxps_avx512vl(auVar72,auVar67);
          auVar62 = vfmadd231ps_avx512vl(ZEXT1632(auVar32),auVar69,auVar62);
          auVar59 = vfmadd231ps_avx512vl(auVar62,auVar68,auVar59);
          auVar62 = vmulps_avx512vl(auVar59,auVar73);
          auVar59 = vblendps_avx(auVar62,auVar77,1);
          auVar76 = vsubps_avx512vl(auVar67,auVar59);
          auVar59 = vblendps_avx(auVar62,auVar77,0x80);
          auVar62 = vaddps_avx512vl(auVar67,auVar59);
          auVar59 = vmaxps_avx512vl(auVar76,auVar62);
          auVar77 = vmaxps_avx512vl(auVar56,auVar59);
          auVar59 = vminps_avx(auVar55,auVar78);
          auVar78 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
          auVar55 = vminps_avx512vl(auVar78,auVar61);
          auVar79 = vminps_avx512vl(auVar55,auVar59);
          in_ZMM25 = ZEXT3264(auVar79);
          auVar59 = vminps_avx(auVar60,auVar64);
          auVar55 = vminps_avx512vl(auVar78,auVar63);
          auVar55 = vminps_avx(auVar55,auVar59);
          auVar59 = vminps_avx(auVar76,auVar62);
          auVar56 = vminps_avx512vl(auVar78,auVar67);
          auVar56 = vminps_avx(auVar56,auVar59);
          auVar45 = vsubps_avx512vl(auVar34,auVar42);
          auVar59 = vbroadcastss_avx512vl(auVar45);
          auVar32._8_8_ = uStack_190;
          auVar32._0_8_ = auVar51._0_8_;
          auVar32 = vsubps_avx512vl(auVar39,auVar32);
          auVar33._0_4_ = auVar32._0_4_ * 0.33333334;
          auVar33._4_4_ = auVar32._4_4_ * 0.33333334;
          auVar33._8_4_ = auVar32._8_4_ * 0.33333334;
          auVar33._12_4_ = auVar32._12_4_ * 0.33333334;
          auVar49 = vaddps_avx512vl(auVar45,auVar33);
          uVar109 = auVar49._0_4_;
          auVar97._4_4_ = uVar109;
          auVar97._0_4_ = uVar109;
          auVar97._8_4_ = uVar109;
          auVar97._12_4_ = uVar109;
          auVar97._16_4_ = uVar109;
          auVar97._20_4_ = uVar109;
          auVar97._24_4_ = uVar109;
          auVar97._28_4_ = uVar109;
          auVar32 = vsubps_avx(auVar44,auVar37);
          auVar47 = vsubps_avx(auVar40,auVar36);
          auVar36._0_4_ = auVar47._0_4_ * 0.33333334;
          auVar36._4_4_ = auVar47._4_4_ * 0.33333334;
          auVar36._8_4_ = auVar47._8_4_ * 0.33333334;
          auVar36._12_4_ = auVar47._12_4_ * 0.33333334;
          auVar47 = vsubps_avx(auVar32,auVar36);
          uVar109 = auVar47._0_4_;
          auVar92._4_4_ = uVar109;
          auVar92._0_4_ = uVar109;
          auVar92._8_4_ = uVar109;
          auVar92._12_4_ = uVar109;
          auVar92._16_4_ = uVar109;
          auVar92._20_4_ = uVar109;
          auVar92._24_4_ = uVar109;
          auVar92._28_4_ = uVar109;
          fVar117 = auVar32._0_4_;
          auVar80._0_4_ = fVar117 * fVar116;
          auVar80._4_4_ = fVar117 * fVar85;
          auVar80._8_4_ = fVar117 * fVar108;
          auVar80._12_4_ = fVar117 * fVar113;
          auVar80._16_4_ = fVar117 * fVar115;
          auVar80._20_4_ = fVar117 * fVar11;
          auVar80._24_4_ = fVar117 * fVar13;
          auVar80._28_4_ = 0;
          auVar60 = vfmadd231ps_avx512vl(auVar80,auVar66,auVar92);
          auVar60 = vfmadd231ps_avx512vl(auVar60,auVar65,auVar97);
          auVar67 = vfmadd231ps_avx512vl(auVar60,auVar71,auVar59);
          auVar60._4_4_ = fVar117 * fVar103;
          auVar60._0_4_ = fVar117 * fVar100;
          auVar60._8_4_ = fVar117 * fVar112;
          auVar60._12_4_ = fVar117 * fVar114;
          auVar60._16_4_ = fVar117 * fVar10;
          auVar60._20_4_ = fVar117 * fVar12;
          auVar60._24_4_ = fVar117 * fVar14;
          auVar60._28_4_ = auVar62._28_4_;
          auVar36 = vfmadd231ps_fma(auVar60,auVar70,auVar92);
          auVar60 = vfmadd231ps_avx512vl(ZEXT1632(auVar36),auVar69,auVar97);
          auVar76 = vfmadd231ps_avx512vl(auVar60,auVar68,auVar59);
          auVar59 = vpermps_avx512vl(auVar74,ZEXT1632(auVar47));
          auVar60 = vpermps_avx512vl(auVar74,ZEXT1632(auVar32));
          auVar61._4_4_ = auVar60._4_4_ * fVar85;
          auVar61._0_4_ = auVar60._0_4_ * fVar116;
          auVar61._8_4_ = auVar60._8_4_ * fVar108;
          auVar61._12_4_ = auVar60._12_4_ * fVar113;
          auVar61._16_4_ = auVar60._16_4_ * fVar115;
          auVar61._20_4_ = auVar60._20_4_ * fVar11;
          auVar61._24_4_ = auVar60._24_4_ * fVar13;
          auVar61._28_4_ = uVar109;
          auVar80 = vfmadd231ps_avx512vl(auVar61,auVar66,auVar59);
          auVar62._4_4_ = auVar60._4_4_ * fVar103;
          auVar62._0_4_ = auVar60._0_4_ * fVar100;
          auVar62._8_4_ = auVar60._8_4_ * fVar112;
          auVar62._12_4_ = auVar60._12_4_ * fVar114;
          auVar62._16_4_ = auVar60._16_4_ * fVar10;
          auVar62._20_4_ = auVar60._20_4_ * fVar12;
          auVar62._24_4_ = auVar60._24_4_ * fVar14;
          auVar62._28_4_ = auVar60._28_4_;
          auVar36 = vfmadd231ps_fma(auVar62,auVar70,auVar59);
          auVar91._8_4_ = 2;
          auVar91._0_8_ = 0x200000002;
          auVar91._12_4_ = 2;
          auVar91._16_4_ = 2;
          auVar91._20_4_ = 2;
          auVar91._24_4_ = 2;
          auVar91._28_4_ = 2;
          auVar59 = vpermps_avx2(auVar91,ZEXT1632(auVar47));
          auVar60 = vpermps_avx2(auVar91,ZEXT1632(auVar32));
          auVar63._4_4_ = auVar60._4_4_ * fVar85;
          auVar63._0_4_ = auVar60._0_4_ * fVar116;
          auVar63._8_4_ = auVar60._8_4_ * fVar108;
          auVar63._12_4_ = auVar60._12_4_ * fVar113;
          auVar63._16_4_ = auVar60._16_4_ * fVar115;
          auVar63._20_4_ = auVar60._20_4_ * fVar11;
          auVar63._24_4_ = auVar60._24_4_ * fVar13;
          auVar63._28_4_ = SUB84(bezier_basis0._3968_8_,4);
          auVar62 = vfmadd231ps_avx512vl(auVar63,auVar59,auVar66);
          auVar64._4_4_ = auVar60._4_4_ * fVar103;
          auVar64._0_4_ = auVar60._0_4_ * fVar100;
          auVar64._8_4_ = auVar60._8_4_ * fVar112;
          auVar64._12_4_ = auVar60._12_4_ * fVar114;
          auVar64._16_4_ = auVar60._16_4_ * fVar10;
          auVar64._20_4_ = auVar60._20_4_ * fVar12;
          auVar64._24_4_ = auVar60._24_4_ * fVar14;
          auVar64._28_4_ = 2;
          auVar60 = vmaxps_avx512vl(auVar72,auVar67);
          auVar63 = vmulps_avx512vl(auVar76,auVar73);
          auVar47 = vfmadd231ps_fma(auVar64,auVar70,auVar59);
          auVar59 = vblendps_avx(auVar63,ZEXT832(0) << 0x20,1);
          auVar61 = vsubps_avx(auVar67,auVar59);
          auVar59 = vblendps_avx(auVar63,ZEXT832(0) << 0x20,0x80);
          auVar102._0_4_ = auVar67._0_4_ + auVar59._0_4_;
          auVar102._4_4_ = auVar67._4_4_ + auVar59._4_4_;
          auVar102._8_4_ = auVar67._8_4_ + auVar59._8_4_;
          auVar102._12_4_ = auVar67._12_4_ + auVar59._12_4_;
          auVar102._16_4_ = auVar67._16_4_ + auVar59._16_4_;
          auVar102._20_4_ = auVar67._20_4_ + auVar59._20_4_;
          auVar102._24_4_ = auVar67._24_4_ + auVar59._24_4_;
          auVar102._28_4_ = auVar67._28_4_ + auVar59._28_4_;
          auVar59 = vmaxps_avx(auVar61,auVar102);
          auVar59 = vmaxps_avx(auVar60,auVar59);
          auVar60 = vshufps_avx(auVar59,auVar59,0xb1);
          auVar59 = vmaxps_avx(auVar59,auVar60);
          auVar60 = vshufpd_avx(auVar59,auVar59,5);
          auVar59 = vmaxps_avx(auVar59,auVar60);
          auVar32 = vmaxps_avx(auVar59._0_16_,auVar59._16_16_);
          auVar59 = vpermps_avx512vl(auVar74,ZEXT1632(auVar49));
          auVar60 = vfmadd231ps_avx512vl(auVar80,auVar65,auVar59);
          auVar59 = vfmadd231ps_avx512vl(ZEXT1632(auVar36),auVar69,auVar59);
          auVar63 = vpermps_avx512vl(auVar74,ZEXT1632(auVar45));
          auVar64 = vfmadd231ps_avx512vl(auVar60,auVar71,auVar63);
          auVar60 = vfmadd231ps_avx512vl(auVar59,auVar68,auVar63);
          auVar59 = vpermps_avx2(auVar91,ZEXT1632(auVar49));
          auVar63 = vfmadd231ps_avx512vl(auVar62,auVar59,auVar65);
          auVar65 = vmaxps_avx512vl(auVar72,auVar64);
          auVar60 = vmulps_avx512vl(auVar60,auVar73);
          auVar66 = vfmadd231ps_avx512vl(ZEXT1632(auVar47),auVar69,auVar59);
          auVar59 = vblendps_avx(auVar60,ZEXT832(0) << 0x20,1);
          auVar62 = vsubps_avx(auVar64,auVar59);
          auVar59 = vblendps_avx(auVar60,ZEXT832(0) << 0x20,0x80);
          auVar98._0_4_ = auVar64._0_4_ + auVar59._0_4_;
          auVar98._4_4_ = auVar64._4_4_ + auVar59._4_4_;
          auVar98._8_4_ = auVar64._8_4_ + auVar59._8_4_;
          auVar98._12_4_ = auVar64._12_4_ + auVar59._12_4_;
          auVar98._16_4_ = auVar64._16_4_ + auVar59._16_4_;
          auVar98._20_4_ = auVar64._20_4_ + auVar59._20_4_;
          auVar98._24_4_ = auVar64._24_4_ + auVar59._24_4_;
          auVar98._28_4_ = auVar64._28_4_ + auVar59._28_4_;
          auVar59 = vmaxps_avx(auVar62,auVar98);
          auVar59 = vmaxps_avx(auVar65,auVar59);
          auVar60 = vshufps_avx(auVar59,auVar59,0xb1);
          auVar59 = vmaxps_avx(auVar59,auVar60);
          auVar60 = vshufpd_avx(auVar59,auVar59,5);
          auVar59 = vmaxps_avx(auVar59,auVar60);
          auVar47 = vmaxps_avx(auVar59._0_16_,auVar59._16_16_);
          auVar47 = vunpcklps_avx(auVar32,auVar47);
          auVar59 = vpermps_avx512vl(auVar91,ZEXT1632(auVar45));
          auVar65 = vfmadd231ps_avx512vl(auVar63,auVar59,auVar71);
          auVar60 = vmaxps_avx512vl(auVar72,auVar65);
          auVar59 = vfmadd231ps_avx512vl(auVar66,auVar68,auVar59);
          auVar66 = vmulps_avx512vl(auVar59,auVar73);
          auVar59 = vblendps_avx(auVar66,ZEXT832(0) << 0x20,1);
          auVar63 = vsubps_avx(auVar65,auVar59);
          auVar59 = vblendps_avx(auVar66,ZEXT832(0) << 0x20,0x80);
          auVar122._0_4_ = auVar65._0_4_ + auVar59._0_4_;
          auVar122._4_4_ = auVar65._4_4_ + auVar59._4_4_;
          auVar122._8_4_ = auVar65._8_4_ + auVar59._8_4_;
          auVar122._12_4_ = auVar65._12_4_ + auVar59._12_4_;
          auVar122._16_4_ = auVar65._16_4_ + auVar59._16_4_;
          auVar122._20_4_ = auVar65._20_4_ + auVar59._20_4_;
          auVar122._24_4_ = auVar65._24_4_ + auVar59._24_4_;
          auVar122._28_4_ = auVar65._28_4_ + auVar59._28_4_;
          auVar59 = vmaxps_avx(auVar63,auVar122);
          auVar59 = vmaxps_avx(auVar60,auVar59);
          auVar60 = vshufps_avx(auVar59,auVar59,0xb1);
          auVar59 = vmaxps_avx(auVar59,auVar60);
          auVar60 = vshufpd_avx(auVar59,auVar59,5);
          auVar59 = vmaxps_avx(auVar59,auVar60);
          auVar32 = vmaxps_avx(auVar59._0_16_,auVar59._16_16_);
          auVar120 = ZEXT1664(CONCAT412(0x5dccb9a2,CONCAT48(0x5dccb9a2,0x5dccb9a25dccb9a2)));
          auVar32 = vinsertps_avx(auVar47,auVar32,0x28);
          auVar59 = vminps_avx(auVar61,auVar102);
          auVar60 = vminps_avx512vl(auVar78,auVar67);
          auVar59 = vminps_avx(auVar60,auVar59);
          auVar60 = vshufps_avx(auVar59,auVar59,0xb1);
          auVar59 = vminps_avx(auVar59,auVar60);
          auVar60 = vshufpd_avx(auVar59,auVar59,5);
          auVar59 = vminps_avx(auVar59,auVar60);
          auVar47 = vminps_avx(auVar59._0_16_,auVar59._16_16_);
          auVar59 = vminps_avx(auVar62,auVar98);
          auVar99 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
          auVar60 = vminps_avx512vl(auVar78,auVar64);
          auVar59 = vminps_avx(auVar60,auVar59);
          auVar60 = vshufps_avx(auVar59,auVar59,0xb1);
          auVar59 = vminps_avx(auVar59,auVar60);
          auVar60 = vshufpd_avx(auVar59,auVar59,5);
          auVar59 = vminps_avx(auVar59,auVar60);
          auVar36 = vminps_avx(auVar59._0_16_,auVar59._16_16_);
          auVar36 = vunpcklps_avx(auVar47,auVar36);
          auVar59 = vminps_avx(auVar63,auVar122);
          auVar111 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
          auVar60 = vminps_avx512vl(auVar78,auVar65);
          auVar59 = vminps_avx(auVar60,auVar59);
          auVar60 = vshufps_avx(auVar59,auVar59,0xb1);
          auVar59 = vminps_avx(auVar59,auVar60);
          auVar60 = vshufpd_avx(auVar59,auVar59,5);
          auVar59 = vminps_avx(auVar59,auVar60);
          auVar47 = vminps_avx(auVar59._0_16_,auVar59._16_16_);
          auVar47 = vinsertps_avx(auVar36,auVar47,0x28);
          auVar59 = vshufps_avx(auVar56,auVar56,0xb1);
          auVar59 = vminps_avx(auVar56,auVar59);
          auVar56 = vshufpd_avx(auVar59,auVar59,5);
          auVar59 = vminps_avx(auVar59,auVar56);
          auVar36 = vminps_avx(auVar59._0_16_,auVar59._16_16_);
          auVar59 = vshufps_avx(auVar55,auVar55,0xb1);
          auVar59 = vminps_avx(auVar55,auVar59);
          auVar55 = vshufpd_avx(auVar59,auVar59,5);
          auVar59 = vminps_avx(auVar59,auVar55);
          auVar45 = vminps_avx(auVar59._0_16_,auVar59._16_16_);
          auVar45 = vunpcklps_avx(auVar36,auVar45);
          auVar59 = vshufps_avx512vl(auVar79,auVar79,0xb1);
          auVar55 = vminps_avx512vl(auVar79,auVar59);
          auVar59 = vshufpd_avx(auVar55,auVar55,5);
          auVar59 = vminps_avx(auVar55,auVar59);
          auVar36 = vminps_avx(auVar59._0_16_,auVar59._16_16_);
          auVar36 = vinsertps_avx(auVar45,auVar36,0x28);
          auVar45 = vminps_avx(auVar47,auVar36);
          auVar59 = vshufps_avx512vl(auVar77,auVar77,0xb1);
          in_YmmResult = vmaxps_avx512vl(auVar77,auVar59);
          auVar59 = vshufpd_avx(in_YmmResult,in_YmmResult,5);
          auVar59 = vmaxps_avx(in_YmmResult,auVar59);
          auVar47 = vmaxps_avx(auVar59._0_16_,auVar59._16_16_);
          auVar59 = vshufps_avx(auVar75,auVar75,0xb1);
          auVar59 = vmaxps_avx(auVar75,auVar59);
          auVar55 = vshufpd_avx(auVar59,auVar59,5);
          auVar59 = vmaxps_avx(auVar59,auVar55);
          auVar36 = vmaxps_avx(auVar59._0_16_,auVar59._16_16_);
          auVar36 = vunpcklps_avx(auVar47,auVar36);
          auVar59 = vshufps_avx(auVar54,auVar54,0xb1);
          auVar59 = vmaxps_avx(auVar54,auVar59);
          auVar54 = vshufpd_avx(auVar59,auVar59,5);
          auVar59 = vmaxps_avx(auVar59,auVar54);
          auVar47 = vmaxps_avx(auVar59._0_16_,auVar59._16_16_);
          auVar47 = vinsertps_avx(auVar36,auVar47,0x28);
          auVar36 = vmaxps_avx(auVar32,auVar47);
          auVar48._8_4_ = 0x7fffffff;
          auVar48._0_8_ = 0x7fffffff7fffffff;
          auVar48._12_4_ = 0x7fffffff;
          auVar32 = vandps_avx(auVar45,auVar48);
          auVar47 = vandps_avx(auVar36,auVar48);
          auVar32 = vmaxps_avx(auVar32,auVar47);
          auVar47 = vmovshdup_avx(auVar32);
          auVar47 = vmaxss_avx(auVar47,auVar32);
          auVar32 = vshufpd_avx(auVar32,auVar32,1);
          auVar32 = vmaxss_avx(auVar32,auVar47);
          fVar116 = auVar32._0_4_ * 4.7683716e-07;
          auVar88._4_4_ = fVar116;
          auVar88._0_4_ = fVar116;
          auVar88._8_4_ = fVar116;
          auVar88._12_4_ = fVar116;
          auVar32 = vsubps_avx(auVar45,auVar88);
          aVar8 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                  vinsertps_avx(auVar32,ZEXT416(geomID),0x30);
          auVar49._0_4_ = auVar36._0_4_ + fVar116;
          auVar49._4_4_ = auVar36._4_4_ + fVar116;
          auVar49._8_4_ = auVar36._8_4_ + fVar116;
          auVar49._12_4_ = auVar36._12_4_ + fVar116;
          aVar9 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                  vinsertps_avx(auVar49,ZEXT416((uint)uVar28),0x30);
          auVar89._0_4_ = aVar8.x + aVar9.x;
          auVar89._4_4_ = aVar8.y + aVar9.y;
          auVar89._8_4_ = aVar8.z + aVar9.z;
          auVar89._12_4_ = aVar8.field_3.w + aVar9.field_3.w;
          local_1e8 = vminps_avx(local_1e8,auVar89);
          local_1d8 = vmaxps_avx(local_1d8,auVar89);
          local_1f8 = vmaxps_avx(local_1f8,(undefined1  [16])aVar9);
          prims[local_210].upper.field_0.field_1 = aVar9;
          local_208 = vminps_avx(local_208,(undefined1  [16])aVar8);
          prims[local_210].lower.field_0.field_1 = aVar8;
          local_218 = local_218 + 1;
          local_210 = local_210 + 1;
          break;
        }
        lVar4 = *(long *)((long)&(pBVar2->super_RawBufferView).ptr_ofs + lVar27);
        lVar5 = *(long *)((long)&(pBVar2->super_RawBufferView).stride + lVar27);
        auVar47 = auVar99._0_16_;
        auVar32 = vandps_avx(ZEXT416(*(uint *)(lVar4 + 0xc + lVar5 * uVar26)),auVar47);
        if (1.844e+18 <= auVar32._0_4_) break;
        auVar32 = vandps_avx(ZEXT416(*(uint *)(lVar4 + 0xc + lVar5 * uVar30)),auVar47);
        if (1.844e+18 <= auVar32._0_4_) break;
        auVar32 = vandps_avx(ZEXT416(*(uint *)(lVar4 + 0xc + lVar5 * uVar31)),auVar47);
        if (1.844e+18 <= auVar32._0_4_) break;
        auVar32 = vandps_avx(ZEXT416(*(uint *)(lVar4 + 0xc + lVar5 * uVar29)),auVar47);
        if (1.844e+18 <= auVar32._0_4_) break;
        auVar32 = *(undefined1 (*) [16])(lVar4 + lVar5 * uVar26);
        auVar47 = auVar111._0_16_;
        uVar15 = vcmpps_avx512vl(auVar32,auVar47,6);
        auVar36 = auVar120._0_16_;
        uVar16 = vcmpps_avx512vl(auVar32,auVar36,1);
        if ((~((ushort)uVar15 & (ushort)uVar16) & 7) != 0) break;
        auVar45 = *(undefined1 (*) [16])(lVar4 + lVar5 * uVar30);
        uVar15 = vcmpps_avx512vl(auVar45,auVar47,6);
        uVar16 = vcmpps_avx512vl(auVar45,auVar36,1);
        if ((~((ushort)uVar15 & (ushort)uVar16) & 7) != 0) break;
        auVar49 = *(undefined1 (*) [16])(lVar4 + lVar5 * uVar31);
        uVar15 = vcmpps_avx512vl(auVar49,auVar47,6);
        uVar16 = vcmpps_avx512vl(auVar49,auVar36,1);
        if ((~((ushort)uVar15 & (ushort)uVar16) & 7) != 0) break;
        auVar88 = *(undefined1 (*) [16])(lVar4 + lVar5 * uVar29);
        uVar15 = vcmpps_avx512vl(auVar88,auVar47,6);
        uVar16 = vcmpps_avx512vl(auVar88,auVar36,1);
        if ((~((ushort)uVar15 & (ushort)uVar16) & 7) != 0) break;
        lVar4 = *(long *)((long)&(pBVar3->super_RawBufferView).ptr_ofs + lVar27);
        lVar5 = *(long *)((long)&(pBVar3->super_RawBufferView).stride + lVar27);
        auVar89 = *(undefined1 (*) [16])(lVar4 + lVar5 * uVar26);
        uVar15 = vcmpps_avx512vl(auVar89,auVar47,6);
        uVar16 = vcmpps_avx512vl(auVar89,auVar36,1);
        if ((~((ushort)uVar15 & (ushort)uVar16) & 7) != 0) break;
        auVar48 = *(undefined1 (*) [16])(lVar4 + lVar5 * uVar30);
        uVar15 = vcmpps_avx512vl(auVar48,auVar47,6);
        uVar16 = vcmpps_avx512vl(auVar48,auVar36,1);
        if ((~((ushort)uVar15 & (ushort)uVar16) & 7) != 0) break;
        auVar47 = vshufps_avx(auVar32,auVar32,0xff);
        auVar46 = vinsertps_avx512f(auVar32,ZEXT416((uint)(auVar47._0_4_ * fVar116)),0x30);
        auVar32 = vshufps_avx(auVar45,auVar45,0xff);
        auVar45 = vinsertps_avx(auVar45,ZEXT416((uint)(auVar32._0_4_ * fVar116)),0x30);
        auVar32 = vshufps_avx(auVar49,auVar49,0xff);
        auVar44 = vinsertps_avx512f(auVar49,ZEXT416((uint)(auVar32._0_4_ * fVar116)),0x30);
        auVar32 = vshufps_avx(auVar88,auVar88,0xff);
        auVar49 = vinsertps_avx(auVar88,ZEXT416((uint)(auVar32._0_4_ * fVar116)),0x30);
        auVar81._8_4_ = 0x80000000;
        auVar81._0_8_ = 0x8000000080000000;
        auVar81._12_4_ = 0x80000000;
        auVar123._0_4_ = auVar49._0_4_ * -0.0;
        auVar123._4_4_ = auVar49._4_4_ * -0.0;
        auVar123._8_4_ = auVar49._8_4_ * -0.0;
        auVar123._12_4_ = auVar49._12_4_ * -0.0;
        auVar32 = vfmadd213ps_avx512vl(ZEXT816(0),auVar44,auVar123);
        auVar32 = vaddps_avx512vl(auVar45,auVar32);
        auVar33 = vfmadd231ps_avx512vl(auVar32,auVar46,auVar81);
        auVar34 = vshufps_avx512vl(auVar33,auVar33,0xff);
        auVar32 = *(undefined1 (*) [16])(lVar4 + lVar5 * uVar31);
        auVar47 = *(undefined1 (*) [16])(lVar4 + lVar5 * uVar29);
        auVar35 = vmulps_avx512vl(auVar47,auVar81);
        auVar36 = vfmadd213ps_avx512vl(ZEXT816(0) << 0x20,auVar32,auVar35);
        auVar40._0_4_ = auVar48._0_4_ + auVar36._0_4_;
        auVar40._4_4_ = auVar48._4_4_ + auVar36._4_4_;
        auVar40._8_4_ = auVar48._8_4_ + auVar36._8_4_;
        auVar40._12_4_ = auVar48._12_4_ + auVar36._12_4_;
        auVar88 = vfmadd231ps_fma(auVar40,auVar89,auVar81);
        auVar59._0_16_ = vxorps_avx512vl(in_ZMM24._0_16_,in_ZMM24._0_16_);
        auVar36 = vmulps_avx512vl(auVar49,auVar59._0_16_);
        auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
        auVar36 = vfmadd231ps_avx512vl(auVar36,auVar44,auVar37);
        auVar36 = vfmadd231ps_avx512vl(auVar36,auVar45,auVar59._0_16_);
        auVar38 = vfnmadd231ps_avx512vl(auVar36,auVar46,auVar37);
        auVar39 = vshufps_avx512vl(auVar38,auVar38,0xc9);
        auVar36 = vshufps_avx(auVar88,auVar88,0xc9);
        auVar36 = vmulps_avx512vl(auVar38,auVar36);
        auVar36 = vfmsub231ps_fma(auVar36,auVar39,auVar88);
        auVar88 = vshufps_avx(auVar36,auVar36,0xc9);
        auVar36 = vdpps_avx(auVar88,auVar88,0x7f);
        fVar85 = auVar36._0_4_;
        auVar53._4_28_ = auVar59._4_28_;
        auVar53._0_4_ = fVar85;
        auVar40 = vrsqrt14ss_avx512f(auVar59._0_16_,auVar53._0_16_);
        auVar41 = vmulss_avx512f(auVar40,ZEXT416(0x3fc00000));
        auVar42 = vmulss_avx512f(auVar36,ZEXT416(0xbf000000));
        auVar42 = vmulss_avx512f(auVar42,auVar40);
        auVar40 = vmulss_avx512f(auVar42,ZEXT416((uint)(auVar40._0_4_ * auVar40._0_4_)));
        auVar41 = vbroadcastss_avx512vl(ZEXT416((uint)(auVar41._0_4_ + auVar40._0_4_)));
        auVar42 = vmulps_avx512vl(auVar88,auVar41);
        auVar40 = vmulps_avx512vl(auVar47,auVar59._0_16_);
        auVar40 = vfmadd231ps_avx512vl(auVar40,auVar32,auVar37);
        auVar40 = vfmadd231ps_avx512vl(auVar40,auVar48,auVar59._0_16_);
        auVar43 = vfnmadd231ps_avx512vl(auVar40,auVar89,auVar37);
        auVar40 = vshufps_avx(auVar43,auVar43,0xc9);
        auVar40 = vmulps_avx512vl(auVar38,auVar40);
        auVar40 = vfmsub231ps_fma(auVar40,auVar39,auVar43);
        auVar84._0_4_ = auVar42._0_4_ * auVar34._0_4_;
        auVar84._4_4_ = auVar42._4_4_ * auVar34._4_4_;
        auVar84._8_4_ = auVar42._8_4_ * auVar34._8_4_;
        auVar84._12_4_ = auVar42._12_4_ * auVar34._12_4_;
        auVar39 = vshufps_avx512vl(auVar38,auVar38,0xff);
        auVar43 = vrcp14ss_avx512f(auVar59._0_16_,auVar53._0_16_);
        auVar36 = vfnmadd213ss_avx512f(auVar36,auVar43,ZEXT416(0x40000000));
        fVar100 = auVar43._0_4_ * auVar36._0_4_;
        auVar36 = vshufps_avx(auVar40,auVar40,0xc9);
        auVar105._0_4_ = fVar85 * auVar36._0_4_;
        auVar105._4_4_ = fVar85 * auVar36._4_4_;
        auVar105._8_4_ = fVar85 * auVar36._8_4_;
        auVar105._12_4_ = fVar85 * auVar36._12_4_;
        auVar36 = vdpps_avx(auVar88,auVar36,0x7f);
        auVar40 = vaddps_avx512vl(auVar33,auVar84);
        fVar85 = auVar36._0_4_;
        auVar118._0_4_ = fVar85 * auVar88._0_4_;
        auVar118._4_4_ = fVar85 * auVar88._4_4_;
        auVar118._8_4_ = fVar85 * auVar88._8_4_;
        auVar118._12_4_ = fVar85 * auVar88._12_4_;
        auVar54 = vbroadcastss_avx512vl(ZEXT416(2));
        auVar55 = vpermps_avx512vl(auVar54,ZEXT1632(auVar40));
        auVar36 = vsubps_avx(auVar105,auVar118);
        auVar93._0_4_ = auVar36._0_4_ * fVar100;
        auVar93._4_4_ = auVar36._4_4_ * fVar100;
        auVar93._8_4_ = auVar36._8_4_ * fVar100;
        auVar93._12_4_ = auVar36._12_4_ * fVar100;
        auVar36 = vmulps_avx512vl(auVar41,auVar93);
        auVar101._0_4_ = auVar42._0_4_ * auVar39._0_4_ + auVar34._0_4_ * auVar36._0_4_;
        auVar101._4_4_ = auVar42._4_4_ * auVar39._4_4_ + auVar34._4_4_ * auVar36._4_4_;
        auVar101._8_4_ = auVar42._8_4_ * auVar39._8_4_ + auVar34._8_4_ * auVar36._8_4_;
        auVar101._12_4_ = auVar42._12_4_ * auVar39._12_4_ + auVar34._12_4_ * auVar36._12_4_;
        auVar36 = vaddps_avx512vl(auVar38,auVar101);
        auVar34 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaab));
        auVar36 = vmulps_avx512vl(auVar36,auVar34);
        fVar103 = auVar40._0_4_;
        fVar115 = fVar103 + auVar36._0_4_;
        auVar66 = ZEXT1632(CONCAT412(auVar40._12_4_ + auVar36._12_4_,
                                     CONCAT48(auVar40._8_4_ + auVar36._8_4_,
                                              CONCAT44(auVar40._4_4_ + auVar36._4_4_,fVar115))));
        auVar56 = vpermps_avx512vl(auVar54,auVar66);
        auVar58._16_16_ = auVar56._16_16_;
        auVar36 = vaddps_avx512vl(auVar32,auVar35);
        auVar36 = vfmadd231ps_avx512vl(auVar36,auVar48,auVar59._0_16_);
        auVar88 = vfmadd231ps_fma(auVar36,auVar89,auVar81);
        auVar36 = vmulps_avx512vl(auVar49,auVar37);
        auVar36 = vfmadd231ps_avx512vl(auVar36,auVar59._0_16_,auVar44);
        auVar36 = vfnmadd231ps_avx512vl(auVar36,auVar37,auVar45);
        auVar35 = vfmadd231ps_avx512vl(auVar36,auVar59._0_16_,auVar46);
        auVar49 = vshufps_avx(auVar35,auVar35,0xc9);
        auVar36 = vshufps_avx(auVar88,auVar88,0xc9);
        fVar108 = auVar35._0_4_;
        auVar106._0_4_ = fVar108 * auVar36._0_4_;
        fVar112 = auVar35._4_4_;
        auVar106._4_4_ = fVar112 * auVar36._4_4_;
        fVar113 = auVar35._8_4_;
        auVar106._8_4_ = fVar113 * auVar36._8_4_;
        fVar114 = auVar35._12_4_;
        auVar106._12_4_ = fVar114 * auVar36._12_4_;
        auVar36 = vfmsub231ps_fma(auVar106,auVar49,auVar88);
        auVar88 = vshufps_avx(auVar36,auVar36,0xc9);
        auVar36 = vdpps_avx(auVar88,auVar88,0x7f);
        auVar44 = vaddps_avx512vl(auVar44,auVar123);
        auVar45 = vfmadd231ps_avx512vl(auVar44,auVar45,auVar59._0_16_);
        auVar45 = vfmadd231ps_avx512vl(auVar45,auVar46,auVar81);
        fVar85 = auVar36._0_4_;
        auVar58._0_16_ = auVar59._0_16_;
        auVar57._4_28_ = auVar58._4_28_;
        auVar57._0_4_ = fVar85;
        auVar46 = vrsqrt14ss_avx512f(auVar59._0_16_,auVar57._0_16_);
        auVar44 = vmulss_avx512f(auVar36,ZEXT416(0xbf000000));
        auVar39 = vmulss_avx512f(auVar46,auVar46);
        auVar44 = vmulss_avx512f(ZEXT416((uint)(auVar44._0_4_ * auVar46._0_4_)),auVar39);
        auVar39 = vshufps_avx512vl(auVar45,auVar45,0xff);
        auVar46 = vmulss_avx512f(auVar46,ZEXT416(0x3fc00000));
        fVar100 = auVar46._0_4_ + auVar44._0_4_;
        auVar125._4_4_ = fVar100;
        auVar125._0_4_ = fVar100;
        auVar125._8_4_ = fVar100;
        auVar125._12_4_ = fVar100;
        auVar46 = vmulps_avx512vl(auVar88,auVar125);
        auVar47 = vmulps_avx512vl(auVar47,auVar37);
        auVar32 = vfmadd231ps_avx512vl(auVar47,auVar59._0_16_,auVar32);
        auVar44 = vmulps_avx512vl(auVar39,auVar46);
        auVar32 = vfnmadd231ps_avx512vl(auVar32,auVar37,auVar48);
        auVar48 = vaddps_avx512vl(auVar45,auVar44);
        auVar47 = vfmadd231ps_avx512vl(auVar32,auVar59._0_16_,auVar89);
        auVar32 = vshufps_avx(auVar47,auVar47,0xc9);
        auVar86._0_4_ = fVar108 * auVar32._0_4_;
        auVar86._4_4_ = fVar112 * auVar32._4_4_;
        auVar86._8_4_ = fVar113 * auVar32._8_4_;
        auVar86._12_4_ = fVar114 * auVar32._12_4_;
        auVar32 = vfmsub231ps_fma(auVar86,auVar49,auVar47);
        auVar32 = vshufps_avx(auVar32,auVar32,0xc9);
        auVar42._0_4_ = fVar85 * auVar32._0_4_;
        auVar42._4_4_ = fVar85 * auVar32._4_4_;
        auVar42._8_4_ = fVar85 * auVar32._8_4_;
        auVar42._12_4_ = fVar85 * auVar32._12_4_;
        auVar32 = vdpps_avx(auVar88,auVar32,0x7f);
        auVar47 = vshufps_avx(auVar35,auVar35,0xff);
        auVar47 = vmulps_avx512vl(auVar47,auVar46);
        fVar85 = auVar32._0_4_;
        auVar87._0_4_ = auVar88._0_4_ * fVar85;
        auVar87._4_4_ = auVar88._4_4_ * fVar85;
        auVar87._8_4_ = auVar88._8_4_ * fVar85;
        auVar87._12_4_ = auVar88._12_4_ * fVar85;
        auVar32 = vsubps_avx(auVar42,auVar87);
        auVar49 = vrcp14ss_avx512f(auVar59._0_16_,auVar57._0_16_);
        auVar36 = vfnmadd213ss_avx512f(auVar36,auVar49,ZEXT416(0x40000000));
        fVar85 = auVar49._0_4_ * auVar36._0_4_;
        auVar43._0_4_ = fVar100 * auVar32._0_4_ * fVar85;
        auVar43._4_4_ = fVar100 * auVar32._4_4_ * fVar85;
        auVar43._8_4_ = fVar100 * auVar32._8_4_ * fVar85;
        auVar43._12_4_ = fVar100 * auVar32._12_4_ * fVar85;
        auVar32 = vmulps_avx512vl(auVar39,auVar43);
        auVar121._0_4_ = auVar47._0_4_ + auVar32._0_4_;
        auVar121._4_4_ = auVar47._4_4_ + auVar32._4_4_;
        auVar121._8_4_ = auVar47._8_4_ + auVar32._8_4_;
        auVar121._12_4_ = auVar47._12_4_ + auVar32._12_4_;
        auVar39._0_4_ = fVar108 + auVar121._0_4_;
        auVar39._4_4_ = fVar112 + auVar121._4_4_;
        auVar39._8_4_ = fVar113 + auVar121._8_4_;
        auVar39._12_4_ = fVar114 + auVar121._12_4_;
        auVar32 = vmulps_avx512vl(auVar39,auVar34);
        auVar32 = vsubps_avx(auVar48,auVar32);
        auVar59 = vpermps_avx512vl(auVar54,ZEXT1632(auVar32));
        auVar54 = vpermps_avx512vl(auVar54,ZEXT1632(auVar48));
        auVar23._8_8_ = bezier_basis0._3952_8_;
        auVar23._0_8_ = bezier_basis0._3944_8_;
        auVar23._16_8_ = bezier_basis0._3960_8_;
        auVar23._24_8_ = bezier_basis0._3968_8_;
        auVar60 = vmulps_avx512vl(auVar54,auVar23);
        auVar24._8_8_ = bezier_basis0._2796_8_;
        auVar24._0_8_ = bezier_basis0._2788_8_;
        auVar24._16_8_ = bezier_basis0._2804_8_;
        auVar24._24_8_ = bezier_basis0._2812_8_;
        auVar60 = vfmadd231ps_avx512vl(auVar60,auVar24,auVar59);
        auVar25._8_8_ = bezier_basis0._1640_8_;
        auVar25._0_8_ = bezier_basis0._1632_8_;
        auVar25._16_8_ = bezier_basis0._1648_8_;
        auVar25._24_8_ = bezier_basis0._1656_8_;
        auVar60 = vfmadd231ps_avx512vl(auVar60,auVar25,auVar56);
        auVar19._8_8_ = bezier_basis0._484_8_;
        auVar19._0_8_ = bezier_basis0._476_8_;
        auVar19._16_8_ = bezier_basis0._492_8_;
        auVar19._24_8_ = bezier_basis0._500_8_;
        auVar60 = vfmadd231ps_avx512vl(auVar60,auVar19,auVar55);
        auVar61 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar62 = vmaxps_avx512vl(auVar61,auVar60);
        auVar54 = vmulps_avx512vl(auVar54,bezier_basis0._8568_32_);
        auVar20._8_8_ = bezier_basis0._7420_8_;
        auVar20._0_8_ = bezier_basis0._7412_8_;
        auVar20._16_8_ = bezier_basis0._7428_8_;
        auVar20._24_8_ = bezier_basis0._7436_8_;
        in_ZMM24 = ZEXT3264(auVar20);
        auVar59 = vfmadd231ps_avx512vl(auVar54,auVar20,auVar59);
        auVar21._8_8_ = bezier_basis0._6264_8_;
        auVar21._0_8_ = bezier_basis0._6256_8_;
        auVar21._16_8_ = bezier_basis0._6272_8_;
        auVar21._24_8_ = bezier_basis0._6280_8_;
        auVar59 = vfmadd231ps_avx512vl(auVar59,auVar21,auVar56);
        auVar22._8_8_ = bezier_basis0._5108_8_;
        auVar22._0_8_ = bezier_basis0._5100_8_;
        auVar22._16_8_ = bezier_basis0._5116_8_;
        auVar22._24_8_ = bezier_basis0._5124_8_;
        auVar59 = vfmadd231ps_avx512vl(auVar59,auVar22,auVar55);
        auVar77._4_4_ = auVar59._4_4_ * 0.055555556;
        auVar77._0_4_ = auVar59._0_4_ * 0.055555556;
        auVar77._8_4_ = auVar59._8_4_ * 0.055555556;
        auVar77._12_4_ = auVar59._12_4_ * 0.055555556;
        auVar77._16_4_ = auVar59._16_4_ * 0.055555556;
        auVar77._20_4_ = auVar59._20_4_ * 0.055555556;
        auVar77._24_4_ = auVar59._24_4_ * 0.055555556;
        auVar77._28_4_ = SUB84(bezier_basis0._6280_8_,4);
        auVar59 = vblendps_avx(auVar77,ZEXT832(0) << 0x20,1);
        auVar63 = vsubps_avx512vl(auVar60,auVar59);
        auVar59 = vblendps_avx(auVar77,ZEXT832(0) << 0x20,0x80);
        auVar64 = vaddps_avx512vl(auVar60,auVar59);
        auVar59 = vmaxps_avx(auVar63,auVar64);
        auVar54 = vmaxps_avx(auVar62,auVar59);
        auVar65 = vbroadcastss_avx512vl(ZEXT416(1));
        auVar59 = vpermps_avx512vl(auVar65,ZEXT1632(auVar40));
        auVar55 = vpermps_avx512vl(auVar65,auVar66);
        auVar56 = vpermps_avx512vl(auVar65,ZEXT1632(auVar32));
        auVar62 = vpermps_avx512vl(auVar65,ZEXT1632(auVar48));
        auVar66 = vmulps_avx512vl(auVar62,auVar23);
        auVar66 = vfmadd231ps_avx512vl(auVar66,auVar24,auVar56);
        auVar66 = vfmadd231ps_avx512vl(auVar66,auVar25,auVar55);
        auVar66 = vfmadd231ps_avx512vl(auVar66,auVar19,auVar59);
        auVar62 = vmulps_avx512vl(auVar62,bezier_basis0._8568_32_);
        auVar56 = vfmadd231ps_avx512vl(auVar62,auVar20,auVar56);
        auVar62 = vmaxps_avx512vl(auVar61,auVar66);
        auVar55 = vfmadd231ps_avx512vl(auVar56,auVar21,auVar55);
        in_ZMM25 = ZEXT3264(auVar21);
        auVar55 = vfmadd231ps_avx512vl(auVar55,auVar22,auVar59);
        auVar17._4_4_ = auVar55._4_4_ * 0.055555556;
        auVar17._0_4_ = auVar55._0_4_ * 0.055555556;
        auVar17._8_4_ = auVar55._8_4_ * 0.055555556;
        auVar17._12_4_ = auVar55._12_4_ * 0.055555556;
        auVar17._16_4_ = auVar55._16_4_ * 0.055555556;
        auVar17._20_4_ = auVar55._20_4_ * 0.055555556;
        auVar17._24_4_ = auVar55._24_4_ * 0.055555556;
        auVar17._28_4_ = auVar59._28_4_;
        auVar59 = vblendps_avx(auVar17,ZEXT832(0) << 0x20,1);
        auVar67 = vsubps_avx512vl(auVar66,auVar59);
        auVar59 = vblendps_avx(auVar17,ZEXT832(0) << 0x20,0x80);
        auVar68 = vaddps_avx512vl(auVar66,auVar59);
        auVar59 = vmaxps_avx(auVar67,auVar68);
        auVar55 = vmaxps_avx(auVar62,auVar59);
        auVar90._4_4_ = fVar103;
        auVar90._0_4_ = fVar103;
        auVar90._8_4_ = fVar103;
        auVar90._12_4_ = fVar103;
        auVar90._16_4_ = fVar103;
        auVar90._20_4_ = fVar103;
        auVar90._24_4_ = fVar103;
        auVar90._28_4_ = fVar103;
        auVar104._4_4_ = fVar115;
        auVar104._0_4_ = fVar115;
        auVar104._8_4_ = fVar115;
        auVar104._12_4_ = fVar115;
        auVar104._16_4_ = fVar115;
        auVar104._20_4_ = fVar115;
        auVar104._24_4_ = fVar115;
        auVar104._28_4_ = fVar115;
        auVar82._0_4_ = auVar32._0_4_;
        auVar82._4_4_ = auVar82._0_4_;
        auVar82._8_4_ = auVar82._0_4_;
        auVar82._12_4_ = auVar82._0_4_;
        auVar82._16_4_ = auVar82._0_4_;
        auVar82._20_4_ = auVar82._0_4_;
        auVar82._24_4_ = auVar82._0_4_;
        auVar82._28_4_ = auVar82._0_4_;
        uVar109 = auVar48._0_4_;
        auVar119._4_4_ = uVar109;
        auVar119._0_4_ = uVar109;
        auVar119._8_4_ = uVar109;
        auVar119._12_4_ = uVar109;
        auVar119._16_4_ = uVar109;
        auVar119._20_4_ = uVar109;
        auVar119._24_4_ = uVar109;
        auVar119._28_4_ = uVar109;
        auVar59 = vmulps_avx512vl(auVar119,auVar23);
        auVar59 = vfmadd231ps_avx512vl(auVar59,auVar24,auVar82);
        auVar59 = vfmadd231ps_avx512vl(auVar59,auVar25,auVar104);
        auVar69 = vfmadd231ps_avx512vl(auVar59,auVar19,auVar90);
        auVar59 = vmulps_avx512vl(auVar119,bezier_basis0._8568_32_);
        auVar59 = vfmadd231ps_avx512vl(auVar59,auVar20,auVar82);
        auVar56 = vmaxps_avx512vl(auVar61,auVar69);
        auVar59 = vfmadd231ps_avx512vl(auVar59,auVar21,auVar104);
        auVar59 = vfmadd231ps_avx512vl(auVar59,auVar22,auVar90);
        auVar18._4_4_ = auVar59._4_4_ * 0.055555556;
        auVar18._0_4_ = auVar59._0_4_ * 0.055555556;
        auVar18._8_4_ = auVar59._8_4_ * 0.055555556;
        auVar18._12_4_ = auVar59._12_4_ * 0.055555556;
        auVar18._16_4_ = auVar59._16_4_ * 0.055555556;
        auVar18._20_4_ = auVar59._20_4_ * 0.055555556;
        auVar18._24_4_ = auVar59._24_4_ * 0.055555556;
        auVar18._28_4_ = fVar103;
        auVar72 = ZEXT832(0) << 0x20;
        auVar59 = vblendps_avx(auVar18,auVar72,1);
        auVar62 = vsubps_avx(auVar69,auVar59);
        auVar59 = vblendps_avx(auVar18,auVar72,0x80);
        auVar70 = vaddps_avx512vl(auVar69,auVar59);
        auVar59 = vmaxps_avx512vl(auVar62,auVar70);
        auVar56 = vmaxps_avx(auVar56,auVar59);
        auVar59 = vminps_avx(auVar63,auVar64);
        auVar71 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar60 = vminps_avx512vl(auVar71,auVar60);
        auVar60 = vminps_avx(auVar60,auVar59);
        auVar61 = vminps_avx512vl(auVar71,auVar66);
        auVar59 = vminps_avx(auVar67,auVar68);
        auVar61 = vminps_avx(auVar61,auVar59);
        auVar59 = vminps_avx512vl(auVar71,auVar69);
        auVar62 = vminps_avx512vl(auVar62,auVar70);
        auVar66 = vminps_avx512vl(auVar59,auVar62);
        auVar36 = vsubps_avx512vl(auVar33,auVar84);
        fVar100 = auVar36._0_4_;
        auVar83._4_4_ = fVar100;
        auVar83._0_4_ = fVar100;
        auVar83._8_4_ = fVar100;
        auVar83._12_4_ = fVar100;
        auVar83._16_4_ = fVar100;
        auVar83._20_4_ = fVar100;
        auVar83._24_4_ = fVar100;
        auVar83._28_4_ = fVar100;
        auVar47 = vsubps_avx512vl(auVar38,auVar101);
        fVar100 = fVar100 + auVar47._0_4_ * 0.33333334;
        auVar95._4_4_ = fVar100;
        auVar95._0_4_ = fVar100;
        auVar95._8_4_ = fVar100;
        auVar95._12_4_ = fVar100;
        auVar95._16_4_ = fVar100;
        auVar95._20_4_ = fVar100;
        auVar95._24_4_ = fVar100;
        auVar95._28_4_ = fVar100;
        auVar45 = vsubps_avx512vl(auVar45,auVar44);
        auVar32 = vsubps_avx(auVar35,auVar121);
        auVar44._0_4_ = auVar32._0_4_ * 0.33333334;
        auVar44._4_4_ = auVar32._4_4_ * 0.33333334;
        auVar44._8_4_ = auVar32._8_4_ * 0.33333334;
        auVar44._12_4_ = auVar32._12_4_ * 0.33333334;
        auVar49 = vsubps_avx512vl(auVar45,auVar44);
        auVar59 = vbroadcastss_avx512vl(auVar49);
        uVar109 = auVar45._0_4_;
        auVar107._4_4_ = uVar109;
        auVar107._0_4_ = uVar109;
        auVar107._8_4_ = uVar109;
        auVar107._12_4_ = uVar109;
        auVar107._16_4_ = uVar109;
        auVar107._20_4_ = uVar109;
        auVar107._24_4_ = uVar109;
        auVar107._28_4_ = uVar109;
        auVar62 = vmulps_avx512vl(auVar107,auVar23);
        auVar62 = vfmadd231ps_avx512vl(auVar62,auVar24,auVar59);
        auVar62 = vfmadd231ps_avx512vl(auVar62,auVar25,auVar95);
        auVar67 = vfmadd231ps_avx512vl(auVar62,auVar19,auVar83);
        auVar68 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar62 = vmaxps_avx512vl(auVar68,auVar67);
        auVar63 = vmulps_avx512vl(auVar107,bezier_basis0._8568_32_);
        auVar59 = vfmadd231ps_avx512vl(auVar63,auVar20,auVar59);
        auVar59 = vfmadd231ps_avx512vl(auVar59,auVar21,auVar95);
        auVar59 = vfmadd231ps_avx512vl(auVar59,auVar22,auVar83);
        auVar69 = vbroadcastss_avx512vl(ZEXT416(0x3d638e39));
        auVar64 = vmulps_avx512vl(auVar59,auVar69);
        auVar59 = vblendps_avx(auVar64,auVar72,1);
        auVar63 = vsubps_avx(auVar67,auVar59);
        auVar59 = vblendps_avx(auVar64,auVar72,0x80);
        auVar110._0_4_ = auVar67._0_4_ + auVar59._0_4_;
        auVar110._4_4_ = auVar67._4_4_ + auVar59._4_4_;
        auVar110._8_4_ = auVar67._8_4_ + auVar59._8_4_;
        auVar110._12_4_ = auVar67._12_4_ + auVar59._12_4_;
        auVar110._16_4_ = auVar67._16_4_ + auVar59._16_4_;
        auVar110._20_4_ = auVar67._20_4_ + auVar59._20_4_;
        auVar110._24_4_ = auVar67._24_4_ + auVar59._24_4_;
        auVar110._28_4_ = auVar67._28_4_ + auVar59._28_4_;
        auVar59 = vmaxps_avx(auVar63,auVar110);
        auVar59 = vmaxps_avx(auVar62,auVar59);
        auVar62 = vshufps_avx(auVar59,auVar59,0xb1);
        auVar59 = vmaxps_avx(auVar59,auVar62);
        auVar62 = vshufpd_avx(auVar59,auVar59,5);
        auVar59 = vmaxps_avx(auVar59,auVar62);
        auVar32 = vmaxps_avx(auVar59._0_16_,auVar59._16_16_);
        auVar59 = vpermps_avx512vl(auVar65,ZEXT1632(auVar36));
        auVar72 = ZEXT1632(CONCAT412(auVar36._12_4_ + auVar47._12_4_ * 0.33333334,
                                     CONCAT48(auVar36._8_4_ + auVar47._8_4_ * 0.33333334,
                                              CONCAT44(auVar36._4_4_ + auVar47._4_4_ * 0.33333334,
                                                       fVar100))));
        auVar62 = vpermps_avx512vl(auVar65,auVar72);
        auVar64 = vpermps_avx512vl(auVar65,ZEXT1632(auVar49));
        auVar65 = vpermps_avx512vl(auVar65,ZEXT1632(auVar45));
        auVar70 = vmulps_avx512vl(auVar65,auVar23);
        auVar70 = vfmadd231ps_avx512vl(auVar70,auVar24,auVar64);
        auVar70 = vfmadd231ps_avx512vl(auVar70,auVar25,auVar62);
        auVar70 = vfmadd231ps_avx512vl(auVar70,auVar19,auVar59);
        auVar65 = vmulps_avx512vl(auVar65,bezier_basis0._8568_32_);
        auVar64 = vfmadd231ps_avx512vl(auVar65,auVar20,auVar64);
        auVar65 = vmaxps_avx512vl(auVar68,auVar70);
        auVar62 = vfmadd231ps_avx512vl(auVar64,auVar21,auVar62);
        auVar59 = vfmadd231ps_avx512vl(auVar62,auVar22,auVar59);
        auVar62 = vmulps_avx512vl(auVar59,auVar69);
        auVar74 = ZEXT832(0) << 0x20;
        auVar59 = vblendps_avx(auVar62,auVar74,1);
        auVar64 = vsubps_avx(auVar70,auVar59);
        auVar59 = vblendps_avx(auVar62,auVar74,0x80);
        auVar96._0_4_ = auVar70._0_4_ + auVar59._0_4_;
        auVar96._4_4_ = auVar70._4_4_ + auVar59._4_4_;
        auVar96._8_4_ = auVar70._8_4_ + auVar59._8_4_;
        auVar96._12_4_ = auVar70._12_4_ + auVar59._12_4_;
        auVar96._16_4_ = auVar70._16_4_ + auVar59._16_4_;
        auVar96._20_4_ = auVar70._20_4_ + auVar59._20_4_;
        auVar96._24_4_ = auVar70._24_4_ + auVar59._24_4_;
        auVar96._28_4_ = auVar70._28_4_ + auVar59._28_4_;
        auVar59 = vmaxps_avx(auVar64,auVar96);
        auVar59 = vmaxps_avx(auVar65,auVar59);
        auVar62 = vshufps_avx(auVar59,auVar59,0xb1);
        auVar59 = vmaxps_avx(auVar59,auVar62);
        auVar62 = vshufpd_avx(auVar59,auVar59,5);
        auVar59 = vmaxps_avx(auVar59,auVar62);
        auVar47 = vmaxps_avx(auVar59._0_16_,auVar59._16_16_);
        auVar47 = vunpcklps_avx(auVar32,auVar47);
        auVar126._8_4_ = 2;
        auVar126._0_8_ = 0x200000002;
        auVar126._12_4_ = 2;
        auVar126._16_4_ = 2;
        auVar126._20_4_ = 2;
        auVar126._24_4_ = 2;
        auVar126._28_4_ = 2;
        auVar59 = vpermps_avx2(auVar126,ZEXT1632(auVar36));
        auVar62 = vpermps_avx2(auVar126,auVar72);
        auVar72 = vpermps_avx512vl(auVar126,ZEXT1632(auVar49));
        auVar65 = vpermps_avx2(auVar126,ZEXT1632(auVar45));
        auVar73 = vmulps_avx512vl(auVar65,auVar23);
        auVar73 = vfmadd231ps_avx512vl(auVar73,auVar24,auVar72);
        auVar73 = vfmadd231ps_avx512vl(auVar73,auVar25,auVar62);
        auVar73 = vfmadd231ps_avx512vl(auVar73,auVar19,auVar59);
        auVar65 = vmulps_avx512vl(auVar65,bezier_basis0._8568_32_);
        auVar65 = vfmadd231ps_avx512vl(auVar65,auVar20,auVar72);
        auVar68 = vmaxps_avx512vl(auVar68,auVar73);
        auVar62 = vfmadd231ps_avx512vl(auVar65,auVar21,auVar62);
        auVar59 = vfmadd231ps_avx512vl(auVar62,auVar22,auVar59);
        auVar62 = vmulps_avx512vl(auVar59,auVar69);
        auVar59 = vblendps_avx(auVar62,auVar74,1);
        auVar65 = vsubps_avx(auVar73,auVar59);
        auVar59 = vblendps_avx(auVar62,auVar74,0x80);
        auVar127._0_4_ = auVar73._0_4_ + auVar59._0_4_;
        auVar127._4_4_ = auVar73._4_4_ + auVar59._4_4_;
        auVar127._8_4_ = auVar73._8_4_ + auVar59._8_4_;
        auVar127._12_4_ = auVar73._12_4_ + auVar59._12_4_;
        auVar127._16_4_ = auVar73._16_4_ + auVar59._16_4_;
        auVar127._20_4_ = auVar73._20_4_ + auVar59._20_4_;
        auVar127._24_4_ = auVar73._24_4_ + auVar59._24_4_;
        auVar127._28_4_ = auVar73._28_4_ + auVar59._28_4_;
        auVar59 = vmaxps_avx(auVar65,auVar127);
        auVar59 = vmaxps_avx(auVar68,auVar59);
        auVar62 = vshufps_avx(auVar59,auVar59,0xb1);
        auVar59 = vmaxps_avx(auVar59,auVar62);
        auVar62 = vshufpd_avx(auVar59,auVar59,5);
        auVar59 = vmaxps_avx(auVar59,auVar62);
        auVar32 = vmaxps_avx(auVar59._0_16_,auVar59._16_16_);
        auVar32 = vinsertps_avx(auVar47,auVar32,0x28);
        auVar59 = vminps_avx(auVar63,auVar110);
        auVar34._8_4_ = 0xddccb9a2;
        auVar34._0_8_ = 0xddccb9a2ddccb9a2;
        auVar34._12_4_ = 0xddccb9a2;
        auVar111 = ZEXT1664(auVar34);
        auVar62 = vminps_avx512vl(auVar71,auVar67);
        auVar59 = vminps_avx(auVar62,auVar59);
        auVar62 = vshufps_avx(auVar59,auVar59,0xb1);
        auVar59 = vminps_avx(auVar59,auVar62);
        auVar62 = vshufpd_avx(auVar59,auVar59,5);
        auVar59 = vminps_avx(auVar59,auVar62);
        auVar47 = vminps_avx(auVar59._0_16_,auVar59._16_16_);
        auVar59 = vminps_avx(auVar64,auVar96);
        auVar62 = vminps_avx512vl(auVar71,auVar70);
        auVar59 = vminps_avx(auVar62,auVar59);
        auVar62 = vshufps_avx(auVar59,auVar59,0xb1);
        auVar59 = vminps_avx(auVar59,auVar62);
        auVar62 = vshufpd_avx(auVar59,auVar59,5);
        auVar59 = vminps_avx(auVar59,auVar62);
        auVar36 = vminps_avx(auVar59._0_16_,auVar59._16_16_);
        auVar36 = vunpcklps_avx(auVar47,auVar36);
        auVar59 = vminps_avx(auVar65,auVar127);
        auVar62 = vminps_avx512vl(auVar71,auVar73);
        auVar59 = vminps_avx(auVar62,auVar59);
        auVar62 = vshufps_avx(auVar59,auVar59,0xb1);
        auVar59 = vminps_avx(auVar59,auVar62);
        auVar62 = vshufpd_avx(auVar59,auVar59,5);
        auVar59 = vminps_avx(auVar59,auVar62);
        auVar47 = vminps_avx(auVar59._0_16_,auVar59._16_16_);
        auVar47 = vinsertps_avx(auVar36,auVar47,0x28);
        auVar59 = vshufps_avx512vl(auVar66,auVar66,0xb1);
        in_YmmResult = vminps_avx512vl(auVar66,auVar59);
        auVar59 = vshufpd_avx(in_YmmResult,in_YmmResult,5);
        auVar59 = vminps_avx(in_YmmResult,auVar59);
        auVar36 = vminps_avx(auVar59._0_16_,auVar59._16_16_);
        auVar59 = vshufps_avx(auVar61,auVar61,0xb1);
        auVar59 = vminps_avx(auVar61,auVar59);
        auVar35._8_4_ = 0x5dccb9a2;
        auVar35._0_8_ = 0x5dccb9a25dccb9a2;
        auVar35._12_4_ = 0x5dccb9a2;
        auVar120 = ZEXT1664(auVar35);
        auVar61 = vshufpd_avx(auVar59,auVar59,5);
        auVar59 = vminps_avx(auVar59,auVar61);
        auVar45 = vminps_avx(auVar59._0_16_,auVar59._16_16_);
        auVar45 = vunpcklps_avx(auVar36,auVar45);
        auVar59 = vshufps_avx(auVar60,auVar60,0xb1);
        auVar59 = vminps_avx(auVar60,auVar59);
        auVar60 = vshufpd_avx(auVar59,auVar59,5);
        auVar59 = vminps_avx(auVar59,auVar60);
        auVar36 = vminps_avx(auVar59._0_16_,auVar59._16_16_);
        auVar99 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
        auVar36 = vinsertps_avx(auVar45,auVar36,0x28);
        auVar45 = vminps_avx(auVar47,auVar36);
        auVar59 = vshufps_avx(auVar56,auVar56,0xb1);
        auVar59 = vmaxps_avx(auVar56,auVar59);
        auVar56 = vshufpd_avx(auVar59,auVar59,5);
        auVar59 = vmaxps_avx(auVar59,auVar56);
        auVar47 = vmaxps_avx(auVar59._0_16_,auVar59._16_16_);
        auVar59 = vshufps_avx(auVar55,auVar55,0xb1);
        auVar59 = vmaxps_avx(auVar55,auVar59);
        auVar55 = vshufpd_avx(auVar59,auVar59,5);
        auVar59 = vmaxps_avx(auVar59,auVar55);
        auVar36 = vmaxps_avx(auVar59._0_16_,auVar59._16_16_);
        auVar36 = vunpcklps_avx(auVar47,auVar36);
        auVar59 = vshufps_avx(auVar54,auVar54,0xb1);
        auVar59 = vmaxps_avx(auVar54,auVar59);
        auVar54 = vshufpd_avx(auVar59,auVar59,5);
        auVar59 = vmaxps_avx(auVar59,auVar54);
        auVar47 = vmaxps_avx(auVar59._0_16_,auVar59._16_16_);
        auVar47 = vinsertps_avx(auVar36,auVar47,0x28);
        auVar32 = vmaxps_avx(auVar32,auVar47);
        uVar15 = vcmpps_avx512vl(auVar32,auVar35,1);
        uVar16 = vcmpps_avx512vl(auVar45,auVar34,6);
        lVar27 = lVar27 + 0x38;
      } while ((~((ushort)uVar15 & (ushort)uVar16) & 7) == 0);
    }
    uVar28 = uVar28 + 1;
  } while( true );
}

Assistant:

PrimInfo createPrimRefArray(PrimRef* prims, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, make_range<size_t>(0, numTimeSegments()))) continue;
          const BBox3fa box = bounds(j);
          const PrimRef prim(box,geomID,unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }